

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O1

DecodeStatus DecodeL6RInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint RegNo;
  DecodeStatus DVar1;
  void *Decoder_00;
  uint uVar2;
  uint uVar3;
  
  uVar2 = Insn >> 6 & 0x1f;
  if (uVar2 < 0x1b) {
    RegNo = (Insn >> 4 & 3) + (uVar2 % 3) * 4;
    Decoder_00 = (void *)(ulong)RegNo;
    uVar3 = Insn >> 0x16 & 0x1f;
    if (uVar3 < 0x1b) {
      DecodeGRRegsRegisterClass(Inst,RegNo,Address,Decoder_00);
      DecodeGRRegsRegisterClass(Inst,(Insn >> 0x14 & 3) + (uVar3 % 3) * 4,Address,Decoder_00);
      DecodeGRRegsRegisterClass
                (Inst,(Insn >> 2 & 3) + (uVar2 / 3 + (uVar2 / 9) * -3) * 4,Address,Decoder_00);
      DecodeGRRegsRegisterClass(Inst,(Insn & 3) + (uVar2 / 9) * 4,Address,Decoder_00);
      DecodeGRRegsRegisterClass
                (Inst,(Insn >> 0x12 & 3) + (uVar3 / 3 + (uVar3 / 9) * -3) * 4,Address,Decoder_00);
      DecodeGRRegsRegisterClass(Inst,(Insn >> 0x10 & 3) + (uVar3 / 9) * 4,Address,Decoder_00);
      DVar1 = MCDisassembler_Success;
    }
    else {
      DVar1 = MCDisassembler_Fail;
    }
  }
  else {
    DVar1 = MCDisassembler_Fail;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeL6RInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		void *Decoder)
{
	unsigned Op1, Op2, Op3, Op4, Op5, Op6;
	DecodeStatus S =
		Decode3OpInstruction(fieldFromInstruction_4(Insn, 0, 16), &Op1, &Op2, &Op3);
	if (S != MCDisassembler_Success)
		return S;

	S = Decode3OpInstruction(fieldFromInstruction_4(Insn, 16, 16), &Op4, &Op5, &Op6);
	if (S != MCDisassembler_Success)
		return S;

	DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op4, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op3, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op5, Address, Decoder);
	DecodeGRRegsRegisterClass(Inst, Op6, Address, Decoder);
	return S;
}